

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::LoginMessageTest_test_decode_version2_Test::
LoginMessageTest_test_decode_version2_Test(LoginMessageTest_test_decode_version2_Test *this)

{
  LoginMessageTest_test_decode_version2_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__LoginMessageTest_test_decode_version2_Test_003d76f8;
  return;
}

Assistant:

TEST(LoginMessageTest, test_decode_version2)
{
    ByteBuffer buffer = BufferUtil::StringAsBuffer(ENCODED_MESSAGE_V2);
    LoginMessage decoded = Decode(buffer, PixieVersion::VERSION2);
    EXPECT_EQ(USERNAME, decoded.GetUsername());
    EXPECT_EQ(PASSWORD, decoded.GetPassword());
    EXPECT_EQ(ALIAS, decoded.GetAlias());
    EXPECT_EQ(APPLICATION, decoded.GetApplication());
    EXPECT_EQ(APPLICATION_VERSION, decoded.GetApplicationVersion());
}